

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denoted.c
# Opt level: O0

Denoted * get_denoted_function(token *id,Type *return_type,Function_Specifier fs)

{
  Denoted *pDVar1;
  Denoted_Function *ret;
  Function_Specifier fs_local;
  Type *return_type_local;
  token *id_local;
  
  pDVar1 = (Denoted *)malloc(0x28);
  pDVar1->denotation = DT_Function;
  pDVar1[1].denotation = DT_Label;
  *(token **)(pDVar1 + 2) = id;
  *(Type **)(pDVar1 + 4) = return_type;
  pDVar1[6].denotation = fs;
  *(undefined8 *)(pDVar1 + 8) = 0;
  return pDVar1;
}

Assistant:

struct Denoted* get_denoted_function(struct token *id,struct Type *return_type,enum Function_Specifier fs)
{
	struct Denoted_Function *ret;
	ret=malloc(sizeof(struct Denoted_Function));
	ret->denotation=DT_Function;
	ret->linkage=LINKAGE_NONE;
	ret->id=id;
	ret->type=return_type;
	ret->function_specifier=fs;
	ret->body=NULL;

	return (struct Denoted*)ret;
}